

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::ciConversion(string *unit_string)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  bool bVar1;
  int iVar2;
  reference pvVar3;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  double dVar5;
  size_type loc;
  const_iterator fnd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffa00;
  undefined7 in_stack_fffffffffffffa08;
  undefined1 in_stack_fffffffffffffa0f;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa10;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa20;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_fffffffffffffa28;
  undefined8 in_stack_fffffffffffffa38;
  undefined1 **ppuVar6;
  undefined2 uVar7;
  allocator_type *in_stack_fffffffffffffa40;
  undefined1 **ppuVar8;
  char (*in_stack_fffffffffffffa48) [4];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffa50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_5a0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  undefined1 local_56f [87];
  undefined1 local_518 [64];
  undefined1 local_4d8 [64];
  undefined1 local_498 [64];
  undefined1 local_458 [64];
  undefined1 local_418 [64];
  undefined1 local_3d8 [64];
  undefined1 local_398 [64];
  undefined1 local_358 [64];
  undefined1 local_318 [64];
  undefined1 local_2d8 [64];
  undefined1 local_298 [64];
  undefined1 local_258 [64];
  undefined1 local_218 [64];
  undefined1 local_1d8 [64];
  undefined1 local_198 [64];
  undefined1 local_158 [64];
  undefined1 local_118 [64];
  undefined1 local_d8 [64];
  undefined1 local_98 [64];
  undefined1 local_58 [64];
  undefined1 *local_18;
  undefined8 local_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8;
  
  uVar7 = (undefined2)((ulong)in_stack_fffffffffffffa38 >> 0x30);
  local_8 = in_RDI;
  if ((ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_),
     iVar2 != 0)) {
    local_56f._15_8_ = local_56f + 0x17;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
              (in_stack_fffffffffffffa50,(char (*) [2])in_stack_fffffffffffffa48,
               (char (*) [2])in_stack_fffffffffffffa40);
    local_56f._15_8_ = local_518;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
              (in_stack_fffffffffffffa50,(char (*) [2])in_stack_fffffffffffffa48,
               (char (*) [2])in_stack_fffffffffffffa40);
    local_56f._15_8_ = local_4d8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
              (in_stack_fffffffffffffa50,(char (*) [2])in_stack_fffffffffffffa48,
               (char (*) [2])in_stack_fffffffffffffa40);
    local_56f._15_8_ = local_498;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
              (in_stack_fffffffffffffa50,(char (*) [3])in_stack_fffffffffffffa48,
               (char (*) [3])in_stack_fffffffffffffa40);
    local_56f._15_8_ = local_458;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
              (in_stack_fffffffffffffa50,(char (*) [3])in_stack_fffffffffffffa48,
               (char (*) [3])in_stack_fffffffffffffa40);
    local_56f._15_8_ = local_418;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
              (in_stack_fffffffffffffa50,(char (*) [3])in_stack_fffffffffffffa48,
               (char (*) [3])in_stack_fffffffffffffa40);
    local_56f._15_8_ = local_3d8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
              (in_stack_fffffffffffffa50,(char (*) [3])in_stack_fffffffffffffa48,
               (char (*) [3])in_stack_fffffffffffffa40);
    local_56f._15_8_ = local_398;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[3],_const_char_(&)[4],_true>
              (in_stack_fffffffffffffa50,(char (*) [3])in_stack_fffffffffffffa48,
               (char (*) [4])in_stack_fffffffffffffa40);
    local_56f._15_8_ = local_358;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
              (in_stack_fffffffffffffa50,(char (*) [3])in_stack_fffffffffffffa48,
               (char (*) [3])in_stack_fffffffffffffa40);
    local_56f._15_8_ = local_318;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[4],_const_char_(&)[4],_true>
              (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
               (char (*) [4])in_stack_fffffffffffffa40);
    local_56f._15_8_ = local_2d8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
              (in_stack_fffffffffffffa50,(char (*) [3])in_stack_fffffffffffffa48,
               (char (*) [3])in_stack_fffffffffffffa40);
    local_56f._15_8_ = local_298;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
              (in_stack_fffffffffffffa50,(char (*) [3])in_stack_fffffffffffffa48,
               (char (*) [3])in_stack_fffffffffffffa40);
    local_56f._15_8_ = local_258;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
              (in_stack_fffffffffffffa50,(char (*) [3])in_stack_fffffffffffffa48,
               (char (*) [3])in_stack_fffffffffffffa40);
    local_56f._15_8_ = local_218;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
              (in_stack_fffffffffffffa50,(char (*) [3])in_stack_fffffffffffffa48,
               (char (*) [3])in_stack_fffffffffffffa40);
    local_56f._15_8_ = local_1d8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
              (in_stack_fffffffffffffa50,(char (*) [3])in_stack_fffffffffffffa48,
               (char (*) [3])in_stack_fffffffffffffa40);
    local_56f._15_8_ = local_198;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[4],_const_char_(&)[4],_true>
              (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
               (char (*) [4])in_stack_fffffffffffffa40);
    local_56f._15_8_ = local_158;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[3],_const_char_(&)[8],_true>
              (in_stack_fffffffffffffa50,(char (*) [3])in_stack_fffffffffffffa48,
               (char (*) [8])in_stack_fffffffffffffa40);
    local_56f._15_8_ = local_118;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
              (in_stack_fffffffffffffa50,(char (*) [3])in_stack_fffffffffffffa48,
               (char (*) [3])in_stack_fffffffffffffa40);
    local_56f._15_8_ = local_d8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
              (in_stack_fffffffffffffa50,(char (*) [3])in_stack_fffffffffffffa48,
               (char (*) [3])in_stack_fffffffffffffa40);
    local_56f._15_8_ = local_98;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
              (in_stack_fffffffffffffa50,(char (*) [3])in_stack_fffffffffffffa48,
               (char (*) [3])in_stack_fffffffffffffa40);
    local_56f._15_8_ = local_58;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
              (in_stack_fffffffffffffa50,(char (*) [3])in_stack_fffffffffffffa48,
               (char (*) [3])in_stack_fffffffffffffa40);
    local_18 = local_56f + 0x17;
    local_10 = 0x15;
    in_stack_fffffffffffff9f8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_56f;
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x7a7778);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa28,
                    (size_type)in_stack_fffffffffffffa18._M_current,
                    (hasher *)in_stack_fffffffffffffa10._M_current,
                    (key_equal *)CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa40);
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_56f);
    ppuVar8 = (undefined1 **)(local_56f + 0x17);
    ppuVar6 = &local_18;
    do {
      ppuVar6 = ppuVar6 + -8;
      CLI::std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(in_stack_fffffffffffffa00);
    } while (ppuVar6 != ppuVar8);
    __cxa_atexit(CLI::std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::~unordered_map,&ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_,
                 &__dso_handle);
    uVar7 = (undefined2)((ulong)ppuVar6 >> 0x30);
    __cxa_guard_release(&ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_);
  }
  local_578 = (char *)std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                (in_stack_fffffffffffff9f8);
  local_580 = (char *)std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08));
  local_588 = (char *)std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                (in_stack_fffffffffffff9f8);
  __result._M_current._7_1_ = in_stack_fffffffffffffa0f;
  __result._M_current._0_7_ = in_stack_fffffffffffffa08;
  local_590 = (char *)std::
                      transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                                (in_stack_fffffffffffffa18,in_stack_fffffffffffffa10,__result,
                                 (_func_int_int *)in_stack_fffffffffffffa00);
  local_598._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)in_stack_fffffffffffff9f8,(key_type *)0x7a78a3);
  local_5a0._M_cur =
       (__node_type *)
       CLI::std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff9f8);
  bVar1 = CLI::std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                      *)&local_598,&local_5a0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
    ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                  *)0x7a78dd);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
    goto LAB_007a7ad1;
  }
  pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffa00);
  if (*pvVar3 == 'P') {
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffffa00,(size_type)in_stack_fffffffffffff9f8);
    *pvVar3 = 'p';
  }
  else {
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffffa00);
    if (*pvVar3 == 'M') {
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffa00,(size_type)in_stack_fffffffffffff9f8);
      *pvVar3 = 'm';
    }
  }
  pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffa00);
  if (*pvVar3 != 'M') goto LAB_007a7ad1;
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    (local_8);
  if (sVar4 == 2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa00);
    dVar5 = getPrefixMultiplier((char)((ulong)in_stack_fffffffffffff9f8 >> 0x38));
    if ((dVar5 == 0.0) && (!NAN(dVar5))) goto LAB_007a7a65;
  }
  else {
LAB_007a7a65:
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      (local_8);
    if (sVar4 != 3) goto LAB_007a7ad1;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa00,(size_type)in_stack_fffffffffffff9f8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa00,(size_type)in_stack_fffffffffffff9f8);
    dVar5 = getPrefixMultiplier2Char((char)((ushort)uVar7 >> 8),(char)uVar7);
    if ((dVar5 == 0.0) && (!NAN(dVar5))) goto LAB_007a7ad1;
  }
  pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffa00);
  *pvVar3 = 'm';
LAB_007a7ad1:
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18._M_current,
                     (size_type)in_stack_fffffffffffffa10._M_current);
  if (sVar4 != 0xffffffffffffffff) {
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffffa00,(size_type)in_stack_fffffffffffff9f8);
    *pvVar3 = 's';
  }
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18._M_current,
                     (size_type)in_stack_fffffffffffffa10._M_current);
  if (sVar4 != 0xffffffffffffffff) {
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffffa00,(size_type)in_stack_fffffffffffff9f8);
    *pvVar3 = 'g';
  }
  return;
}

Assistant:

static void ciConversion(std::string& unit_string)
{
    static const std::unordered_map<std::string, std::string> ciConversions{
        {"S", "s"},        {"G", "g"},     {"M", "m"},   {"MM", "mm"},
        {"NM", "nm"},      {"ML", "mL"},   {"GS", "Gs"}, {"GL", "Gal"},
        {"MG", "mg"},      {"[G]", "[g]"}, {"PG", "pg"}, {"NG", "ng"},
        {"UG", "ug"},      {"US", "us"},   {"PS", "ps"}, {"RAD", "rad"},
        {"GB", "gilbert"}, {"WB", "Wb"},   {"CP", "cP"}, {"EV", "eV"},
        {"PT", "pT"},
    };
    // transform to upper case so we have a common starting point
    std::transform(
        unit_string.begin(), unit_string.end(), unit_string.begin(), ::toupper);
    auto fnd = ciConversions.find(unit_string);
    if (fnd != ciConversions.end()) {
        unit_string = fnd->second;
    } else {
        if (unit_string.front() == 'P') {
            unit_string[0] = 'p';
        } else if (unit_string.front() == 'M') {
            unit_string[0] = 'm';
        }
        // deal with situation with meter as captital M
        if (unit_string.back() == 'M') {
            if ((unit_string.length() == 2 &&
                 getPrefixMultiplier(unit_string.front()) != 0.0) ||
                (unit_string.length() == 3 &&
                 getPrefixMultiplier2Char(unit_string[0], unit_string[1]) !=
                     0.0)) {
                unit_string.back() = 'm';
            }
        }
    }
    auto loc = unit_string.find("/S");
    if (loc != std::string::npos) {
        unit_string[loc + 1] = 's';
    }
    loc = unit_string.find("/G");
    if (loc != std::string::npos) {
        unit_string[loc + 1] = 'g';
    }
}